

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttlo_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1,uint32_t sel)

{
  CPUMIPSState_conflict5 *pCVar1;
  CPUMIPSState_conflict5 *other;
  int other_tc;
  uint32_t sel_local;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  other._0_4_ = env->CP0_VPEControl & 0xff;
  other._4_4_ = sel;
  _other_tc = arg1;
  arg1_local = (target_ulong)env;
  pCVar1 = mips_cpu_map_tc(env,(int *)&other);
  if ((uint)other == pCVar1->current_tc) {
    (pCVar1->active_tc).LO[other._4_4_] = _other_tc;
  }
  else {
    pCVar1->tcs[(int)(uint)other].LO[other._4_4_] = _other_tc;
  }
  return;
}

Assistant:

void helper_mttlo(CPUMIPSState *env, target_ulong arg1, uint32_t sel)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.LO[sel] = arg1;
    } else {
        other->tcs[other_tc].LO[sel] = arg1;
    }
}